

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

size_type __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InnerMap::CopyListToTree(InnerMap *this,size_type b,Tree *tree)

{
  Node *pNVar1;
  size_type this_00;
  Node *next;
  long *local_38;
  Node *local_30;
  Node *node;
  size_type count;
  Tree *tree_local;
  size_type b_local;
  InnerMap *this_local;
  
  node = (Node *)0x0;
  local_30 = (Node *)this->table_[b];
  count = (size_type)tree;
  tree_local = (Tree *)b;
  b_local = (size_type)this;
  while (this_00 = count, local_30 != (Node *)0x0) {
    local_38 = KeyPtrFromNodePtr(local_30);
    std::
    set<long_*,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::KeyCompare,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::MapAllocator<long_*>_>
    ::insert((set<long_*,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::InnerMap::KeyCompare,_google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::MapAllocator<long_*>_>
              *)this_00,&local_38);
    node = (Node *)((long)&(node->kv).k_ + 1);
    pNVar1 = local_30->next;
    local_30->next = (Node *)0x0;
    local_30 = pNVar1;
  }
  return (size_type)node;
}

Assistant:

size_type CopyListToTree(size_type b, Tree* tree) {
      size_type count = 0;
      Node* node = static_cast<Node*>(table_[b]);
      while (node != NULL) {
        tree->insert(KeyPtrFromNodePtr(node));
        ++count;
        Node* next = node->next;
        node->next = NULL;
        node = next;
      }
      return count;
    }